

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PcacheSetPageSize(PCache *pCache,int szPage)

{
  _func_void_sqlite3_pcache_ptr_int *p_Var1;
  int iVar2;
  sqlite3_pcache *psVar3;
  int in_ESI;
  PCache *in_RDI;
  sqlite3_pcache *pNew;
  
  if (in_RDI->szPage != 0) {
    psVar3 = (*sqlite3Config.pcache2.xCreate)(in_ESI,in_RDI->szExtra + 0x50,(int)in_RDI->bPurgeable)
    ;
    p_Var1 = sqlite3Config.pcache2.xCachesize;
    if (psVar3 == (sqlite3_pcache *)0x0) {
      return 7;
    }
    iVar2 = numberOfCachePages(in_RDI);
    (*p_Var1)(psVar3,iVar2);
    if (in_RDI->pCache != (sqlite3_pcache *)0x0) {
      (*sqlite3Config.pcache2.xDestroy)(in_RDI->pCache);
    }
    in_RDI->pCache = psVar3;
    in_RDI->szPage = in_ESI;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3PcacheSetPageSize(PCache *pCache, int szPage){
  assert( pCache->nRefSum==0 && pCache->pDirty==0 );
  if( pCache->szPage ){
    sqlite3_pcache *pNew;
    pNew = sqlite3GlobalConfig.pcache2.xCreate(
                szPage, pCache->szExtra + ROUND8(sizeof(PgHdr)),
                pCache->bPurgeable
    );
    if( pNew==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3GlobalConfig.pcache2.xCachesize(pNew, numberOfCachePages(pCache));
    if( pCache->pCache ){
      sqlite3GlobalConfig.pcache2.xDestroy(pCache->pCache);
    }
    pCache->pCache = pNew;
    pCache->szPage = szPage;
    pcacheTrace(("%p.PAGESIZE %d\n",pCache,szPage));
  }
  return SQLITE_OK;
}